

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

BlockRef * __thiscall
node::anon_unknown_2::MinerImpl::waitTipChanged
          (BlockRef *__return_storage_ptr__,MinerImpl *this,uint256 current_tip,
          MillisecondsDouble timeout)

{
  bool bVar1;
  long lVar2;
  KernelNotifications *pKVar3;
  ChainstateManager *pCVar4;
  Chainstate *pCVar5;
  base_blob<256U> *__atime;
  long in_FS_OFFSET;
  double dVar6;
  double local_70;
  unique_lock<std::mutex> local_68;
  base_blob<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = std::chrono::_V2::steady_clock::now();
  dVar6 = timeout.__r * 1000000.0 + (double)lVar2;
  local_70 = 9.223372036854776e+18;
  if ((double)lVar2 <= dVar6) {
    local_70 = dVar6;
  }
  pKVar3 = notifications(this);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_68,&pKVar3->m_tip_block_mutex,
             "notifications().m_tip_block_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
             ,0x3b4,false);
  do {
    pKVar3 = notifications(this);
    local_58.m_data._M_elems[0x10] = '\0';
    local_58.m_data._M_elems[0x11] = '\0';
    local_58.m_data._M_elems[0x12] = '\0';
    local_58.m_data._M_elems[0x13] = '\0';
    local_58.m_data._M_elems[0x14] = '\0';
    local_58.m_data._M_elems[0x15] = '\0';
    local_58.m_data._M_elems[0x16] = '\0';
    local_58.m_data._M_elems[0x17] = '\0';
    local_58.m_data._M_elems[0x18] = '\0';
    local_58.m_data._M_elems[0x19] = '\0';
    local_58.m_data._M_elems[0x1a] = '\0';
    local_58.m_data._M_elems[0x1b] = '\0';
    local_58.m_data._M_elems[0x1c] = '\0';
    local_58.m_data._M_elems[0x1d] = '\0';
    local_58.m_data._M_elems[0x1e] = '\0';
    local_58.m_data._M_elems[0x1f] = '\0';
    local_58.m_data._M_elems._0_8_ = (mutex_type *)0x0;
    local_58.m_data._M_elems[8] = false;
    local_58.m_data._M_elems[9] = 0;
    local_58.m_data._M_elems[10] = 0;
    local_58.m_data._M_elems[0xb] = 0;
    local_58.m_data._M_elems[0xc] = 0;
    local_58.m_data._M_elems[0xd] = 0;
    local_58.m_data._M_elems[0xe] = 0;
    local_58.m_data._M_elems[0xf] = 0;
    bVar1 = ::operator==(&(pKVar3->m_tip_block).super_base_blob<256U>,&local_58);
    if (!bVar1) {
      pKVar3 = notifications(this);
      bVar1 = ::operator==(&(pKVar3->m_tip_block).super_base_blob<256U>,
                           &current_tip.super_base_blob<256U>);
      if (!bVar1) {
LAB_0022f8ad:
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_58,&cs_main,
                   "::cs_main",
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                   ,0x3bc,false);
        pCVar4 = chainman(this);
        pCVar5 = ChainstateManager::ActiveChainstate(pCVar4);
        CBlockIndex::GetBlockHash
                  (&__return_storage_ptr__->hash,
                   (pCVar5->m_chain).vChain.
                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]);
        pCVar4 = chainman(this);
        pCVar5 = ChainstateManager::ActiveChainstate(pCVar4);
        __return_storage_ptr__->height =
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->nHeight;
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
        __stack_chk_fail();
      }
    }
    pCVar4 = chainman(this);
    bVar1 = util::SignalInterrupt::operator_cast_to_bool(pCVar4->m_interrupt);
    if (bVar1) goto LAB_0022f8ad;
    lVar2 = std::chrono::_V2::steady_clock::now();
    if (local_70 <= (double)lVar2) goto LAB_0022f8ad;
    pKVar3 = notifications(this);
    local_58.m_data._M_elems._0_8_ = (double)lVar2 + 1000000000.0;
    __atime = &local_58;
    if (local_70 <= (double)local_58.m_data._M_elems._0_8_) {
      __atime = (base_blob<256U> *)&local_70;
    }
    std::condition_variable::
    __wait_until_impl<std::chrono::duration<double,std::ratio<1l,1000000000l>>>
              (&pKVar3->m_tip_block_cv,&local_68,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)__atime);
  } while( true );
}

Assistant:

BlockRef waitTipChanged(uint256 current_tip, MillisecondsDouble timeout) override
    {
        // Interrupt check interval
        const MillisecondsDouble tick{1000};
        auto now{std::chrono::steady_clock::now()};
        auto deadline = now + timeout;
        // std::chrono does not check against overflow
        if (deadline < now) deadline = std::chrono::steady_clock::time_point::max();
        {
            WAIT_LOCK(notifications().m_tip_block_mutex, lock);
            while ((notifications().m_tip_block == uint256() || notifications().m_tip_block == current_tip) && !chainman().m_interrupt) {
                now = std::chrono::steady_clock::now();
                if (now >= deadline) break;
                notifications().m_tip_block_cv.wait_until(lock, std::min(deadline, now + tick));
            }
        }
        // Must release m_tip_block_mutex before locking cs_main, to avoid deadlocks.
        LOCK(::cs_main);
        return BlockRef{chainman().ActiveChain().Tip()->GetBlockHash(), chainman().ActiveChain().Tip()->nHeight};
    }